

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[43],char_const(&)[67],char_const(&)[37],unsigned_int&,char_const(&)[2]>
          (CompilerGLSL *this,char (*ts) [43],char (*ts_1) [67],char (*ts_2) [37],uint *ts_3,
          char (*ts_4) [2])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  char (*in_stack_ffffffffffffff88) [2];
  uint local_5c;
  undefined1 local_58 [4];
  uint32_t i;
  char (*local_38) [2];
  char (*ts_local_4) [2];
  uint *ts_local_3;
  char (*ts_local_2) [37];
  char (*ts_local_1) [67];
  char (*ts_local) [43];
  CompilerGLSL *this_local;
  
  local_38 = ts_4;
  ts_local_4 = (char (*) [2])ts_3;
  ts_local_3 = (uint *)ts_2;
  ts_local_2 = (char (*) [37])ts_1;
  ts_local_1 = (char (*) [67])ts;
  ts_local = (char (*) [43])this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_5c = 0; local_5c < this->indent; local_5c = local_5c + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<char_const(&)[43],char_const(&)[67],char_const(&)[37],unsigned_int&,char_const(&)[2]>
              (this,(char (*) [43])ts_local_1,(char (*) [67])ts_local_2,(char (*) [37])ts_local_3,
               (uint *)ts_local_4,local_38);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<char_const(&)[43],char_const(&)[67],char_const(&)[37],unsigned_int&,char_const(&)[2]>
              ((string *)local_58,(spirv_cross *)ts_local_1,(char (*) [43])ts_local_2,
               (char (*) [67])ts_local_3,(char (*) [37])ts_local_4,(uint *)local_38,
               in_stack_ffffffffffffff88);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    ::std::__cxx11::string::~string((string *)local_58);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}